

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeMemSetDouble(Mem *pMem,double val)

{
  double y;
  double z;
  
  if (NAN(val)) {
    sqlite3VdbeMemSetNull(pMem);
    return;
  }
  sqlite3VdbeMemRelease(pMem);
  pMem->r = val;
  pMem->flags = 8;
  pMem->type = '\x02';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetDouble(Mem *pMem, double val){
  if( sqlite3IsNaN(val) ){
    sqlite3VdbeMemSetNull(pMem);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->r = val;
    pMem->flags = MEM_Real;
    pMem->type = SQLITE_FLOAT;
  }
}